

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_ecdsa_init
              (LIBSSH2_SESSION *session,uchar *hostkey_data,size_t hostkey_data_len,void **abstract)

{
  int iVar1;
  undefined1 local_80 [8];
  string_buf buf;
  size_t sStack_60;
  libssh2_curve_type type;
  size_t len;
  size_t key_len;
  uchar *public_key;
  uchar *domain;
  uchar *type_str;
  EC_KEY *ecdsactx;
  void **abstract_local;
  size_t hostkey_data_len_local;
  uchar *hostkey_data_local;
  LIBSSH2_SESSION *session_local;
  
  type_str = (uchar *)0x0;
  ecdsactx = (EC_KEY *)abstract;
  abstract_local = (void **)hostkey_data_len;
  hostkey_data_len_local = (size_t)hostkey_data;
  hostkey_data_local = (uchar *)session;
  if ((abstract != (void **)0x0) && (*abstract != (void *)0x0)) {
    hostkey_method_ssh_ecdsa_dtor(session,abstract);
    *(undefined8 *)ecdsactx = 0;
  }
  if (abstract_local < (void **)0x27) {
    session_local._4_4_ = -1;
  }
  else {
    local_80 = (undefined1  [8])hostkey_data_len_local;
    buf.data = (uchar *)hostkey_data_len_local;
    buf.dataptr = (uchar *)abstract_local;
    iVar1 = _libssh2_get_string((string_buf *)local_80,&domain,&stack0xffffffffffffffa0);
    if ((iVar1 == 0) && (sStack_60 == 0x13)) {
      iVar1 = strncmp((char *)domain,"ecdsa-sha2-nistp256",0x13);
      if (iVar1 == 0) {
        buf.len._4_4_ = LIBSSH2_EC_CURVE_NISTP256;
      }
      else {
        iVar1 = strncmp((char *)domain,"ecdsa-sha2-nistp384",0x13);
        if (iVar1 == 0) {
          buf.len._4_4_ = LIBSSH2_EC_CURVE_NISTP384;
        }
        else {
          iVar1 = strncmp((char *)domain,"ecdsa-sha2-nistp521",0x13);
          if (iVar1 != 0) {
            return -1;
          }
          buf.len._4_4_ = LIBSSH2_EC_CURVE_NISTP521;
        }
      }
      iVar1 = _libssh2_get_string((string_buf *)local_80,&public_key,&stack0xffffffffffffffa0);
      if ((iVar1 == 0) && (sStack_60 == 8)) {
        if ((buf.len._4_4_ == LIBSSH2_EC_CURVE_NISTP256) &&
           (iVar1 = strncmp((char *)public_key,"nistp256",8), iVar1 != 0)) {
          session_local._4_4_ = -1;
        }
        else if ((buf.len._4_4_ == LIBSSH2_EC_CURVE_NISTP384) &&
                (iVar1 = strncmp((char *)public_key,"nistp384",8), iVar1 != 0)) {
          session_local._4_4_ = -1;
        }
        else if ((buf.len._4_4_ == LIBSSH2_EC_CURVE_NISTP521) &&
                (iVar1 = strncmp((char *)public_key,"nistp521",8), iVar1 != 0)) {
          session_local._4_4_ = -1;
        }
        else {
          iVar1 = _libssh2_get_string((string_buf *)local_80,(uchar **)&key_len,&len);
          if (iVar1 == 0) {
            iVar1 = _libssh2_eob((string_buf *)local_80);
            if (iVar1 == 0) {
              session_local._4_4_ = -1;
            }
            else {
              iVar1 = _libssh2_ecdsa_curve_name_with_octal_new
                                ((EC_KEY **)&type_str,(uchar *)key_len,len,buf.len._4_4_);
              if (iVar1 == 0) {
                if (ecdsactx != (EC_KEY *)0x0) {
                  *(uchar **)ecdsactx = type_str;
                }
                session_local._4_4_ = 0;
              }
              else {
                session_local._4_4_ = -1;
              }
            }
          }
          else {
            session_local._4_4_ = -1;
          }
        }
      }
      else {
        session_local._4_4_ = -1;
      }
    }
    else {
      session_local._4_4_ = -1;
    }
  }
  return session_local._4_4_;
}

Assistant:

static int
hostkey_method_ssh_ecdsa_init(LIBSSH2_SESSION * session,
                              const unsigned char *hostkey_data,
                              size_t hostkey_data_len,
                              void **abstract)
{
    libssh2_ecdsa_ctx *ecdsactx = NULL;
    unsigned char *type_str, *domain, *public_key;
    size_t key_len, len;
    libssh2_curve_type type;
    struct string_buf buf;

    if(abstract && *abstract) {
        hostkey_method_ssh_ecdsa_dtor(session, abstract);
        *abstract = NULL;
    }

    if(hostkey_data_len < 39) {
        _libssh2_debug((session, LIBSSH2_TRACE_ERROR,
                       "host key length too short"));
        return -1;
    }

    buf.data = (unsigned char *)hostkey_data;
    buf.dataptr = buf.data;
    buf.len = hostkey_data_len;

    if(_libssh2_get_string(&buf, &type_str, &len) || len != 19)
        return -1;

    if(strncmp((char *) type_str, "ecdsa-sha2-nistp256", 19) == 0) {
        type = LIBSSH2_EC_CURVE_NISTP256;
    }
    else if(strncmp((char *) type_str, "ecdsa-sha2-nistp384", 19) == 0) {
        type = LIBSSH2_EC_CURVE_NISTP384;
    }
    else if(strncmp((char *) type_str, "ecdsa-sha2-nistp521", 19) == 0) {
        type = LIBSSH2_EC_CURVE_NISTP521;
    }
    else {
        return -1;
    }

    if(_libssh2_get_string(&buf, &domain, &len) || len != 8)
        return -1;

    if(type == LIBSSH2_EC_CURVE_NISTP256 &&
       strncmp((char *)domain, "nistp256", 8) != 0) {
        return -1;
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP384 &&
            strncmp((char *)domain, "nistp384", 8) != 0) {
        return -1;
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP521 &&
            strncmp((char *)domain, "nistp521", 8) != 0) {
        return -1;
    }

    /* public key */
    if(_libssh2_get_string(&buf, &public_key, &key_len))
        return -1;

    if(!_libssh2_eob(&buf))
        return -1;

    if(_libssh2_ecdsa_curve_name_with_octal_new(&ecdsactx, public_key,
                                                key_len, type))
        return -1;

    if(abstract)
        *abstract = ecdsactx;

    return 0;
}